

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O0

void la_dcross_o(double *x,int incx,double *y,int incy,double *z,int incz)

{
  int incz_local;
  double *z_local;
  int incy_local;
  double *y_local;
  int incx_local;
  double *x_local;
  
  if (x == (double *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x7e,"void la_dcross_o(const double *, int, const double *, int, double *, int)")
    ;
  }
  if (y == (double *)0x0) {
    __assert_fail("y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x7f,"void la_dcross_o(const double *, int, const double *, int, double *, int)")
    ;
  }
  if (z == (double *)0x0) {
    __assert_fail("z",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x80,"void la_dcross_o(const double *, int, const double *, int, double *, int)")
    ;
  }
  if (x != z) {
    if (y != z) {
      *z = x[incx] * y[incy << 1] + -(x[incx << 1] * y[incy]);
      z[incz] = x[incx << 1] * *y + -(*x * y[incy << 1]);
      z[incz << 1] = *x * y[incy] + -(x[incx] * *y);
      return;
    }
    __assert_fail("y != z",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x82,"void la_dcross_o(const double *, int, const double *, int, double *, int)")
    ;
  }
  __assert_fail("x != z",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0x81,"void la_dcross_o(const double *, int, const double *, int, double *, int)");
}

Assistant:

void la_dcross_o(
        const double *x, int incx,
        const double *y, int incy,
        double *z, int incz)
{
    assert(x);
    assert(y);
    assert(z);
    assert(x != z);
    assert(y != z);

    // z1 = a2 b3 - a3 b2
    z[0 * incz] = x[1 * incx] * y[2 * incy] - x[2 * incx] * y[1 * incy];

    // z2 = a3 b1 - a1 b3
    z[1 * incz] = x[2 * incx] * y[0 * incy] - x[0 * incx] * y[2 * incy];

    // z3 = a1 b2 - a2 b1
    z[2 * incz] = x[0 * incx] * y[1 * incy] - x[1 * incx] * y[0 * incy];
}